

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool intersection(Segment *segment,BoundingBox *box)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vector VVar10;
  Point local_28;
  
  local_28 = operator-(segment->b,&segment->a);
  VVar10 = normalize(&local_28);
  fVar6 = 1.0 / VVar10.x;
  fVar7 = 1.0 / VVar10.y;
  fVar4 = 1.0 / VVar10.z;
  fVar9 = (segment->a).x;
  fVar8 = (segment->a).y;
  fVar3 = ((box->vMin).x - fVar9) * fVar6;
  fVar6 = ((box->vMax).x - fVar9) * fVar6;
  fVar2 = ((box->vMin).y - fVar8) * fVar7;
  fVar7 = ((box->vMax).y - fVar8) * fVar7;
  fVar9 = (segment->a).z;
  fVar8 = ((box->vMin).z - fVar9) * fVar4;
  fVar4 = ((box->vMax).z - fVar9) * fVar4;
  fVar9 = fVar7;
  if (fVar7 <= fVar2) {
    fVar9 = fVar2;
  }
  fVar5 = fVar6;
  if (fVar6 <= fVar3) {
    fVar5 = fVar3;
  }
  if (fVar5 <= fVar9) {
    fVar9 = fVar5;
  }
  fVar5 = fVar4;
  if (fVar4 <= fVar8) {
    fVar5 = fVar8;
  }
  if (fVar9 <= fVar5) {
    fVar5 = fVar9;
  }
  if (0.0 <= fVar5) {
    if (fVar3 <= fVar6) {
      fVar6 = fVar3;
    }
    if (fVar2 <= fVar7) {
      fVar7 = fVar2;
    }
    if (fVar7 <= fVar6) {
      fVar7 = fVar6;
    }
    if (fVar8 <= fVar4) {
      fVar4 = fVar8;
    }
    if (fVar4 <= fVar7) {
      fVar4 = fVar7;
    }
    bVar1 = fVar4 <= fVar5;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool intersection(Segment const& segment, BoundingBox const& box)
{
  Vector dir = normalize(segment.b - segment.a);
  float dirfracX;
  float dirfracY;
  float dirfracZ;
  dirfracX = 1.0f / dir.x;
  dirfracY = 1.0f / dir.y;
  dirfracZ = 1.0f / dir.z;

  float t1 = (box.vMin.x - segment.a.x) * dirfracX;
  float t2 = (box.vMax.x - segment.a.x) * dirfracX;
  float t3 = (box.vMin.y - segment.a.y) * dirfracY;
  float t4 = (box.vMax.y - segment.a.y) * dirfracY;
  float t5 = (box.vMin.z - segment.a.z) * dirfracZ;
  float t6 = (box.vMax.z - segment.a.z) * dirfracZ;

  float tmin = std::max(std::max(std::min(t1, t2), std::min(t3, t4)), std::min(t5, t6));
  float tmax = std::min(std::min(std::max(t1, t2), std::max(t3, t4)), std::max(t5, t6));

  if (tmax < 0)
  {
    return false;
  }

  if (tmin > tmax)
  {
    return false;
  }
  return true;
}